

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

void __thiscall
TElasticity2DAnalytic::Sigma
          (TElasticity2DAnalytic *this,TPZVec<double> *x,TPZFMatrix<double> *sigma)

{
  long lVar1;
  REAL RVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_118;
  TPZFMatrix<double> local_e0;
  double local_50 [5];
  
  local_e0.fElem = local_50;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018a08f0;
  local_e0.fSize = 4;
  local_e0.fGiven = local_e0.fElem;
  TPZVec<int>::TPZVec(&local_e0.fPivot.super_TPZVec<int>,0);
  local_e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_e0.fPivot.super_TPZVec<int>.fStore = local_e0.fPivot.fExtAlloc;
  local_e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_e0.fWork.fStore = (double *)0x0;
  local_e0.fWork.fNElements = 0;
  local_e0.fWork.fNAlloc = 0;
  local_e0.fElem = (double *)0x0;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018a0600;
  (*(sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (sigma,2,2);
  dVar3 = gE;
  if (gOscilatoryElasticity != 0) {
    dVar3 = sin((*x->fStore + -0.5) * 31.41592653589793);
    dVar4 = cos(x->fStore[1] * 31.41592653589793);
    dVar3 = (dVar4 * dVar3 * 0.3 + 1.0) * 100.0;
  }
  RVar2 = gPoisson;
  graduxy<double,double>(this,x,&local_e0);
  if (this->fPlaneStress == 0) {
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dVar4 = RVar2 + 1.0;
    dVar5 = (dVar3 / dVar4) / (1.0 - (RVar2 + RVar2));
    *sigma->fElem =
         (*local_e0.fElem * (1.0 - RVar2) +
         local_e0.fElem[local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] * RVar2) *
         dVar5;
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
       ((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    sigma->fElem[(sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1] =
         dVar5 * ((1.0 - RVar2) *
                  local_e0.fElem[local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] +
                 RVar2 * *local_e0.fElem);
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    sigma->fElem[lVar1] =
         (local_e0.fElem[local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] +
         local_e0.fElem[1]) * (dVar3 / (dVar4 + dVar4));
    if ((lVar1 < 1) || ((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    local_118 = sigma->fElem[lVar1];
    if ((lVar1 < 2) || ((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
  }
  else {
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dVar4 = dVar3 / (1.0 - RVar2 * RVar2);
    *sigma->fElem =
         (local_e0.fElem[local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] * RVar2 +
         *local_e0.fElem) * dVar4;
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
       ((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    sigma->fElem[(sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 1] =
         dVar4 * (*local_e0.fElem * RVar2 +
                 local_e0.fElem[local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1]);
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
       (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    sigma->fElem[lVar1] =
         (local_e0.fElem[local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] +
         local_e0.fElem[1]) * (dVar3 / (RVar2 + 1.0 + RVar2 + 1.0));
    if ((lVar1 < 1) || ((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    local_118 = sigma->fElem[lVar1];
    if ((lVar1 < 2) || ((sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
  }
  sigma->fElem[1] = local_118;
  TPZFMatrix<double>::~TPZFMatrix(&local_e0,&PTR_PTR_018a08b8);
  return;
}

Assistant:

void TElasticity2DAnalytic::Sigma(const TPZVec<REAL> &x, TPZFMatrix<STATE> &sigma) const
{
    TPZFNMatrix<4,STATE> grad;
    REAL E, nu;
    sigma.Resize(2,2);
    Elastic(x, E, nu);
    graduxy(x,grad);
    //uxy(x,u);
    if (fPlaneStress == 0)
    {
        STATE Fac = E/((STATE)1.+nu)/((STATE(1.)-STATE(2.)*nu));
        sigma(0,0) = Fac*((STATE(1.)-nu)*grad(0,0)+nu*grad(1,1));
        sigma(1,1) = Fac*((STATE(1.)-nu)*grad(1,1)+nu*grad(0,0));
        sigma(0,1) = E/(STATE(2.)*(STATE(1.)+nu))*(grad(0,1)+grad(1,0));
        sigma(1,0) = sigma(0,1);
    }
    else
    {
        STATE Fac = E/((STATE)1.-nu*nu);
        sigma(0,0) = Fac*(grad(0,0)+nu*grad(1,1));
        sigma(1,1) = Fac*(grad(1,1)+nu*grad(0,0));
        sigma(0,1) = E/(STATE(2.)*(STATE(1.)+nu))*(grad(0,1)+grad(1,0));
        sigma(1,0) = sigma(0,1);
    }
}